

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

GLuint gl4cts::KHRDebug::LabelsTest::createBuffer(Functions *gl,RenderContext *rc)

{
  char *pcVar1;
  bool bVar2;
  uint in_EAX;
  ContextType ctxType;
  GLenum err;
  int line;
  GLuint id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])(rc);
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar2) {
    (*gl->createBuffers)(1,(GLuint *)((long)&uStack_18 + 4));
    err = (*gl->getError)();
    pcVar1 = "glCreateBuffers";
    line = 0x375;
  }
  else {
    (*gl->genBuffers)(1,(GLuint *)((long)&uStack_18 + 4));
    (*gl->bindBuffer)(0x8892,uStack_18._4_4_);
    err = (*gl->getError)();
    pcVar1 = "glGenBuffers";
    line = 0x37b;
  }
  glu::checkError(err,pcVar1 + 2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,line);
  return uStack_18._4_4_;
}

Assistant:

GLuint LabelsTest::createBuffer(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;

	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createBuffers(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateBuffers");
	}
	else
	{
		gl->genBuffers(1, &id);
		gl->bindBuffer(GL_ARRAY_BUFFER, id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenBuffers");
	}

	return id;
}